

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGhostObject.cpp
# Opt level: O3

void __thiscall
cbtPairCachingGhostObject::addOverlappingObjectInternal
          (cbtPairCachingGhostObject *this,cbtBroadphaseProxy *otherProxy,
          cbtBroadphaseProxy *thisProxy)

{
  cbtCollisionObject *pcVar1;
  cbtCollisionObject **ptr;
  int iVar2;
  ulong uVar3;
  cbtCollisionObject **ppcVar4;
  ulong uVar5;
  int iVar6;
  
  if (thisProxy == (cbtBroadphaseProxy *)0x0) {
    thisProxy = (this->super_cbtGhostObject).super_cbtCollisionObject.m_broadphaseHandle;
  }
  pcVar1 = (cbtCollisionObject *)otherProxy->m_clientObject;
  iVar2 = (this->super_cbtGhostObject).m_overlappingObjects.m_size;
  uVar3 = (ulong)iVar2;
  if (0 < (long)uVar3) {
    uVar5 = 0;
    do {
      if ((this->super_cbtGhostObject).m_overlappingObjects.m_data[uVar5] == pcVar1) {
        if (iVar2 != (int)uVar5) {
          return;
        }
        break;
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  if (iVar2 == (this->super_cbtGhostObject).m_overlappingObjects.m_capacity) {
    iVar6 = 1;
    if (iVar2 != 0) {
      iVar6 = iVar2 * 2;
    }
    if (iVar2 < iVar6) {
      if (iVar6 == 0) {
        ppcVar4 = (cbtCollisionObject **)0x0;
      }
      else {
        ppcVar4 = (cbtCollisionObject **)cbtAlignedAllocInternal((long)iVar6 << 3,0x10);
        uVar3 = (ulong)(uint)(this->super_cbtGhostObject).m_overlappingObjects.m_size;
      }
      iVar2 = (int)uVar3;
      if (0 < iVar2) {
        uVar5 = 0;
        do {
          ppcVar4[uVar5] = (this->super_cbtGhostObject).m_overlappingObjects.m_data[uVar5];
          uVar5 = uVar5 + 1;
        } while ((uVar3 & 0xffffffff) != uVar5);
      }
      ptr = (this->super_cbtGhostObject).m_overlappingObjects.m_data;
      if ((ptr != (cbtCollisionObject **)0x0) &&
         ((this->super_cbtGhostObject).m_overlappingObjects.m_ownsMemory == true)) {
        cbtAlignedFreeInternal(ptr);
        iVar2 = (this->super_cbtGhostObject).m_overlappingObjects.m_size;
      }
      (this->super_cbtGhostObject).m_overlappingObjects.m_ownsMemory = true;
      (this->super_cbtGhostObject).m_overlappingObjects.m_data = ppcVar4;
      (this->super_cbtGhostObject).m_overlappingObjects.m_capacity = iVar6;
    }
  }
  (this->super_cbtGhostObject).m_overlappingObjects.m_data[iVar2] = pcVar1;
  (this->super_cbtGhostObject).m_overlappingObjects.m_size = iVar2 + 1;
  (*(this->m_hashPairCache->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback.
    _vptr_cbtOverlappingPairCallback[2])(this->m_hashPairCache,thisProxy,otherProxy);
  return;
}

Assistant:

void cbtPairCachingGhostObject::addOverlappingObjectInternal(cbtBroadphaseProxy* otherProxy, cbtBroadphaseProxy* thisProxy)
{
	cbtBroadphaseProxy* actualThisProxy = thisProxy ? thisProxy : getBroadphaseHandle();
	cbtAssert(actualThisProxy);

	cbtCollisionObject* otherObject = (cbtCollisionObject*)otherProxy->m_clientObject;
	cbtAssert(otherObject);
	int index = m_overlappingObjects.findLinearSearch(otherObject);
	if (index == m_overlappingObjects.size())
	{
		m_overlappingObjects.push_back(otherObject);
		m_hashPairCache->addOverlappingPair(actualThisProxy, otherProxy);
	}
}